

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void kj::Arena::destroyObject<capnp::compiler::NodeTranslator::StructLayout::Union>(void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)pointer + 0x38);
  if (lVar1 != 0) {
    lVar2 = *(long *)((long)pointer + 0x40);
    lVar3 = *(long *)((long)pointer + 0x48);
    *(undefined8 *)((long)pointer + 0x38) = 0;
    *(undefined8 *)((long)pointer + 0x40) = 0;
    *(undefined8 *)((long)pointer + 0x48) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x50))
              (*(undefined8 **)((long)pointer + 0x50),lVar1,4,lVar2 - lVar1 >> 2,lVar3 - lVar1 >> 2,
               0);
  }
  lVar1 = *(long *)((long)pointer + 0x18);
  if (lVar1 != 0) {
    lVar2 = *(long *)((long)pointer + 0x20);
    lVar3 = *(long *)((long)pointer + 0x28);
    *(undefined8 *)((long)pointer + 0x18) = 0;
    *(undefined8 *)((long)pointer + 0x20) = 0;
    *(undefined8 *)((long)pointer + 0x28) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x30))
              (*(undefined8 **)((long)pointer + 0x30),lVar1,8,lVar2 - lVar1 >> 3,lVar3 - lVar1 >> 3,
               0);
    return;
  }
  return;
}

Assistant:

static void destroyObject(void* pointer) {
    dtor(*reinterpret_cast<T*>(pointer));
  }